

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
pstore::small_vector<unsigned_char,128ul>::assign<unsigned_char_const*>
          (small_vector<unsigned_char,128ul> *this,uchar *first,uchar *last)

{
  if (*(long *)(this + 0x90) != *(long *)(this + 0x88)) {
    *(long *)(this + 0x90) = *(long *)(this + 0x88);
  }
  *(undefined8 *)this = 0;
  *(small_vector<unsigned_char,128ul> **)(this + 0xa0) = this + 8;
  for (; first != last; first = first + 1) {
    small_vector<unsigned_char,_128UL>::push_back((small_vector<unsigned_char,_128UL> *)this,first);
  }
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::assign (InputIt first, InputIt last) {
        this->clear ();
        for (; first != last; ++first) {
            this->push_back (*first);
        }
    }